

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O2

Time __thiscall Storage::Tape::Tape::get_current_time(Tape *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  bool bVar3;
  Time time;
  Time local_28;
  
  local_28.length = 0;
  local_28.clock_rate = 1;
  iVar1 = (*this->_vptr_Tape[1])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  this->offset_ = 0;
  (*this->_vptr_Tape[8])(this);
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    get_next_pulse(this);
    Time::operator+=(&local_28,&(this->pulse_).length);
  }
  return local_28;
}

Assistant:

Storage::Time Tape::get_current_time() {
	Time time(0);
	uint64_t steps = get_offset();
	reset();
	while(steps--) {
		get_next_pulse();
		time += pulse_.length;
	}
	return time;
}